

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::Texture2DMipmapCase::iterate(Texture2DMipmapCase *this)

{
  ostringstream *this_00;
  TextureFormat TVar1;
  CoordType CVar2;
  int iVar3;
  CoordType CVar4;
  RenderContext *context;
  TestLog *pTVar5;
  int iVar6;
  int iVar7;
  int i;
  int iVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar10;
  undefined4 extraout_var_01;
  NotSupportedError *this_01;
  Surface *pSVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int iVar12;
  int iVar13;
  long lVar14;
  void *pvVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  ulong local_498;
  int local_48c;
  RandomViewport viewport;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  long local_440;
  TextureRenderer *local_438;
  long local_430;
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_408 [48];
  undefined1 local_3d8 [40];
  Surface renderedFrame;
  Surface referenceFrame;
  undefined1 local_380 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture2DView local_330;
  ulong local_320;
  PixelFormat *local_318;
  Texture2D *local_310;
  Vector<int,_4> res_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  _Alloc_hider local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8 [6];
  undefined1 local_270 [24];
  undefined8 local_258;
  size_type sStack_250;
  BVec4 local_248;
  ReferenceParams sampleParams;
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  undefined4 local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_180 [4];
  ios_base local_138 [264];
  
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar8);
  local_310 = this->m_texture;
  iVar13 = (local_310->m_refTexture).m_width << 2;
  iVar12 = (local_310->m_refTexture).m_height << 2;
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar9 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar8),iVar13,iVar12,dVar9);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&sampleParams,TEXTURETYPE_2D);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CVar2 = this->m_coordType;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  iVar8 = viewport.width + 3;
  if (-1 < viewport.width) {
    iVar8 = viewport.width;
  }
  iVar3 = viewport.height + 3;
  if (-1 < viewport.height) {
    iVar3 = viewport.height;
  }
  if ((viewport.width < iVar13 >> 1) || (viewport.height < iVar12 >> 1)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
               ,0x116);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_1b0,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
  sampleParams.sampler.magFilter = local_1b0._16_4_;
  sampleParams.sampler.lodThreshold = (float)local_1b0._20_4_;
  sampleParams.sampler.normalizedCoords = (bool)local_1b0[0x18];
  sampleParams.sampler._25_3_ = local_1b0._25_3_;
  sampleParams.sampler.compare = local_1b0._28_4_;
  sampleParams.sampler.wrapS = local_1b0._0_4_;
  sampleParams.sampler.wrapT = local_1b0._4_4_;
  sampleParams.sampler.wrapR = local_1b0._8_4_;
  sampleParams.sampler.minFilter = local_1b0._12_4_;
  sampleParams.sampler._32_8_ = local_190._M_p;
  sampleParams.sampler.borderColor.v.uData[1] = local_188;
  sampleParams.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  sampleParams.super_RenderParams.flags =
       (uint)(CVar2 == COORDTYPE_PROJECTED) + (uint)(CVar2 == COORDTYPE_BASIC_BIAS) * 2;
  sampleParams.lodMode = LODMODE_EXACT;
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar14 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar14 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar14 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar14 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar14 + 0x1360))(0xde1,0x2800,0x2600);
  dVar9 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar9,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x128);
  if (iterate()::s_projections == '\0') {
    iterate();
  }
  iVar8 = iVar8 >> 2;
  iVar3 = iVar3 >> 2;
  local_438 = &this->m_renderer;
  lVar18 = 0;
  lVar10 = 0;
  do {
    iVar12 = iVar3 * (int)lVar10;
    iVar13 = 0;
    iVar19 = 0;
    local_440 = lVar18;
    local_430 = lVar10;
    for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
      iVar6 = viewport.width + iVar19;
      if (lVar16 != 0x30) {
        iVar6 = iVar8;
      }
      iVar7 = viewport.height - iVar12;
      if (local_430 != 3) {
        iVar7 = iVar3;
      }
      CVar4 = this->m_coordType;
      uVar17 = (uint)lVar18;
      if (CVar4 < COORDTYPE_AFFINE) {
LAB_00349982:
        getBasicTexCoord2D(&texCoord,uVar17);
      }
      else if (CVar4 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D(&texCoord,uVar17);
      }
      else if (CVar4 == COORDTYPE_PROJECTED) goto LAB_00349982;
      if (CVar2 == COORDTYPE_PROJECTED) {
        sampleParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar16);
        sampleParams.super_RenderParams.w.m_data._8_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar16 + 8);
      }
      if (CVar2 == COORDTYPE_BASIC_BIAS) {
        sampleParams.super_RenderParams.bias =
             Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar17 & 7];
      }
      (**(code **)(lVar14 + 0x1a00))(viewport.x + iVar13,viewport.y + iVar12,iVar6,iVar7);
      lVar18 = lVar18 + 1;
      iVar19 = iVar19 - iVar8;
      iVar13 = iVar13 + iVar8;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (local_438,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams.super_RenderParams);
    }
    lVar10 = local_430 + 1;
    lVar18 = local_440 + 4;
  } while (lVar10 != 4);
  context = this->m_renderCtx;
  res_1.m_data[0] = 8;
  res_1.m_data[1] = 3;
  pvVar15 = (void *)renderedFrame.m_pixels.m_cap;
  if (renderedFrame.m_pixels.m_cap != 0) {
    pvVar15 = renderedFrame.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&res_1,renderedFrame.m_width,
             renderedFrame.m_height,1,pvVar15);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1b0);
  iVar12 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar14 = CONCAT44(extraout_var_01,iVar12);
  uVar17 = this->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
  local_318 = (PixelFormat *)(lVar14 + 8);
  lVar10 = 0;
  do {
    *(undefined4 *)(local_270 + lVar10 * 4) = 0x16;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 3;
  do {
    *(undefined4 *)(local_270 + lVar10 * 4) = 0x10;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  local_258._0_4_ = 0.0;
  local_258._4_4_ = 0.0;
  sStack_250._0_4_ = 0.0;
  sStack_250._4_4_ = 0.0;
  local_248.m_data[0] = true;
  local_248.m_data[1] = true;
  local_248.m_data[2] = true;
  local_248.m_data[3] = true;
  lodPrec.rule = RULE_OPENGL;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_270._0_4_ = 0x14;
  local_270._4_4_ = 0x14;
  local_270._8_4_ = 0;
  local_270._12_4_ = 0x10;
  local_270._16_4_ = 0x10;
  local_270._20_4_ = 0;
  local_3d8._0_4_ = ((TextureFormat *)(lVar14 + 8))->order;
  local_3d8._4_4_ = ((TextureFormat *)(lVar14 + 8))->type;
  local_3d8._8_8_ = *(size_type *)(lVar14 + 0x10);
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar10 = 0;
  do {
    res.m_data[lVar10] = *(int *)(local_3d8 + lVar10 * 4) + ~(uint)((uVar17 & 0xfffffffe) == 0x2702)
    ;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_408._0_4_ = R;
  local_408._4_4_ = SNORM_INT8;
  local_408._8_8_ = 0;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar10 = 0;
  do {
    iVar12 = *(int *)(local_408 + lVar10 * 4);
    if (*(int *)(local_408 + lVar10 * 4) < res.m_data[lVar10]) {
      iVar12 = res.m_data[lVar10];
    }
    res_1.m_data[lVar10] = iVar12;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  tcu::computeFixedPointThreshold((tcu *)local_1b0,&res_1);
  local_258._0_4_ = (float)local_1b0._0_4_;
  local_258._4_4_ = (float)local_1b0._4_4_;
  sStack_250 = local_1b0._8_8_;
  local_248.m_data[1] = 0 < *(int *)(lVar14 + 0xc);
  local_248.m_data[0] = 0 < *(int *)(lVar14 + 8);
  local_248.m_data[2] = 0 < *(int *)(lVar14 + 0x10);
  local_248.m_data[3] = 0 < *(int *)(lVar14 + 0x14);
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = (uint)(CVar2 != COORDTYPE_PROJECTED) * 2 + 6;
  local_498 = 0;
  lVar14 = 0;
  local_48c = 0;
  do {
    local_438 = (TextureRenderer *)
                (Accuracy::Texture2DMipmapCase::iterate::s_bias + ((uint)local_498 & 7));
    iVar12 = iVar3 * (int)lVar14;
    lVar10 = 0;
    iVar19 = 0;
    iVar13 = 0;
    local_440 = lVar14;
    local_320 = local_498;
    do {
      local_430 = CONCAT44(local_430._4_4_,iVar13);
      iVar13 = viewport.width + iVar13;
      if (lVar10 != 0x30) {
        iVar13 = iVar8;
      }
      iVar6 = viewport.height - iVar12;
      if (local_440 != 3) {
        iVar6 = iVar3;
      }
      CVar4 = this->m_coordType;
      if (CVar4 < COORDTYPE_AFFINE) {
LAB_00349d0a:
        getBasicTexCoord2D(&texCoord,(int)local_498);
      }
      else if (CVar4 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D(&texCoord,(int)local_498);
      }
      else if (CVar4 == COORDTYPE_PROJECTED) goto LAB_00349d0a;
      if (CVar2 == COORDTYPE_PROJECTED) {
        sampleParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar10);
        sampleParams.super_RenderParams.w.m_data._8_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar10 + 8);
      }
      if (CVar2 == COORDTYPE_BASIC_BIAS) {
        sampleParams.super_RenderParams.bias = *(float *)local_438;
      }
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_1b0,&referenceFrame,local_318,iVar19,iVar12,iVar13,iVar6);
      res_1.m_data._8_8_ = (local_310->m_refTexture).m_view.m_levels;
      res_1.m_data[0] = (local_310->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_1b0,(Texture2DView *)&res_1,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&sampleParams);
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar15 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar15 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res_1,(TextureFormat *)&res,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar15);
      tcu::getSubregion((PixelBufferAccess *)local_1b0,(PixelBufferAccess *)&res_1,iVar19,iVar12,
                        iVar13,iVar6);
      local_408._0_4_ = RGBA;
      local_408._4_4_ = UNORM_INT8;
      pvVar15 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar15 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3d8,(TextureFormat *)local_408,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar15);
      tcu::getSubregion((PixelBufferAccess *)&res,(PixelBufferAccess *)local_3d8,iVar19,iVar12,
                        iVar13,iVar6);
      local_330.m_numLevels = 8;
      local_330._4_4_ = 3;
      pvVar15 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar15 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_380,(TextureFormat *)&local_330,errorMask.m_width,
                 errorMask.m_height,1,pvVar15);
      tcu::getSubregion((PixelBufferAccess *)local_408,(PixelBufferAccess *)local_380,iVar19,iVar12,
                        iVar13,iVar6);
      local_330.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
      local_330.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
      iVar13 = glu::TextureTestUtil::computeTextureLookupDiff
                         ((ConstPixelBufferAccess *)local_1b0,(ConstPixelBufferAccess *)&res,
                          (PixelBufferAccess *)local_408,&local_330,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,&sampleParams,
                          (LookupPrecision *)local_270,&lodPrec,
                          ((this->super_TestCase).super_TestNode.m_testCtx)->m_watchDog);
      local_48c = local_48c + iVar13;
      iVar13 = (int)local_430 - iVar8;
      iVar19 = iVar19 + iVar8;
      lVar10 = lVar10 + 0x10;
      local_498 = (ulong)((int)local_498 + 1);
      local_438 = (TextureRenderer *)((long)local_438 + 4);
    } while (lVar10 != 0x40);
    lVar14 = local_440 + 1;
    local_498 = (ulong)((int)local_320 + 4);
    if (lVar14 == 4) {
      if (0 < local_48c) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"ERROR: Image verification failed, found ",0x28);
        std::ostream::operator<<(this_00,local_48c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
      }
      pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      res.m_data._0_8_ = &local_458;
      std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Result","");
      local_3d8._0_8_ = (long)local_3d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"Verification result","");
      tcu::LogImageSet::LogImageSet((LogImageSet *)&res_1,(string *)&res,(string *)local_3d8);
      tcu::TestLog::startImageSet(pTVar5,(char *)res_1.m_data._0_8_,local_2e8._M_p);
      local_408._0_8_ = (long)local_408 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Rendered","");
      TVar1 = (TextureFormat)((long)local_380 + 0x10);
      local_380._0_8_ = TVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"Rendered image","");
      pSVar11 = &renderedFrame;
      tcu::LogImage::LogImage
                ((LogImage *)local_1b0,(string *)local_408,(string *)local_380,pSVar11,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar5,__buf,(size_t)pSVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != aaStack_180) {
        operator_delete(local_190._M_p,
                        CONCAT44(aaStack_180[0]._M_allocated_capacity._4_4_,
                                 (undefined4)aaStack_180[0]._M_allocated_capacity) + 1);
      }
      if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      if ((TextureFormat)local_380._0_8_ != TVar1) {
        operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
      }
      if (local_408._0_8_ != (long)local_408 + 0x10) {
        operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_p != local_2d8) {
        operator_delete(local_2e8._M_p,local_2d8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res_1.m_data._0_8_ != &local_2f8) {
        operator_delete((void *)res_1.m_data._0_8_,local_2f8._M_allocated_capacity + 1);
      }
      if (local_3d8._0_8_ != (long)local_3d8 + 0x10) {
        operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res.m_data._0_8_ != &local_458) {
        operator_delete((void *)res.m_data._0_8_,local_458._M_allocated_capacity + 1);
      }
      if (0 < local_48c) {
        pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
        res.m_data._0_8_ = &local_458;
        std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Reference","");
        local_3d8._0_8_ = (long)local_3d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"Ideal reference","");
        pSVar11 = &referenceFrame;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1b0,(string *)&res,(string *)local_3d8,pSVar11,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar8 = (int)pTVar5;
        tcu::LogImage::write((LogImage *)local_1b0,iVar8,__buf_00,(size_t)pSVar11);
        local_408._0_8_ = (long)local_408 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"ErrorMask","");
        local_380._0_8_ = TVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"Error mask","");
        pSVar11 = &errorMask;
        tcu::LogImage::LogImage
                  ((LogImage *)&res_1,(string *)local_408,(string *)local_380,pSVar11,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&res_1,iVar8,__buf_01,(size_t)pSVar11);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_p != local_2d8) {
          operator_delete(local_2e8._M_p,local_2d8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)res_1.m_data._0_8_ != &local_2f8) {
          operator_delete((void *)res_1.m_data._0_8_,local_2f8._M_allocated_capacity + 1);
        }
        if ((TextureFormat)local_380._0_8_ != TVar1) {
          operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
        }
        if (local_408._0_8_ != (long)local_408 + 0x10) {
          operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_p != aaStack_180) {
          operator_delete(local_190._M_p,
                          CONCAT44(aaStack_180[0]._M_allocated_capacity._4_4_,
                                   (undefined4)aaStack_180[0]._M_allocated_capacity) + 1);
        }
        if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        if (local_3d8._0_8_ != (long)local_3d8 + 0x10) {
          operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)res.m_data._0_8_ != &local_458) {
          operator_delete((void *)res.m_data._0_8_,local_458._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet(((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
      description = "Pass";
      if (local_48c != 0) {
        description = "Image verification failed";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(local_48c != 0),description)
      ;
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&referenceFrame);
      tcu::Surface::~Surface(&renderedFrame);
      if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

Texture2DMipmapCase::IterateResult Texture2DMipmapCase::iterate (void)
{
	const glw::Functions&		gl					= m_renderCtx.getFunctions();

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();

	const deUint32				magFilter			= GL_NEAREST;
	const int					texWidth			= refTexture.getWidth();
	const int					texHeight			= refTexture.getHeight();
	const int					defViewportWidth	= texWidth*4;
	const int					defViewportHeight	= texHeight*4;

	const RandomViewport		viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	ReferenceParams				sampleParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;

	const bool					isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool					useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	int							gridWidth			= 4;
	int							gridHeight			= 4;
	int							cellWidth			= viewport.width / gridWidth;
	int							cellHeight			= viewport.height / gridHeight;

	// Bail out if rendertarget is too small.
	if (viewport.width < defViewportWidth/2 || viewport.height < defViewportHeight/2)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
	sampleParams.samplerType	= glu::TextureTestUtil::getSamplerType(m_texture->getRefTexture().getFormat());
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	sampleParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int		curX		= cellWidth*gridX;
			const int		curY		= cellHeight*gridY;
			const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			const int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const tcu::PixelFormat&	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				// Compute texcoord.
				switch (m_coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}